

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_256_paramSetA.c
# Opt level: O1

int point_mul_g_id_tc26_gost_3410_2012_256_paramSetA
              (EC_GROUP *group,EC_POINT *r,BIGNUM *n,BN_CTX *ctx)

{
  char cVar1;
  char cVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  uint64_t x2;
  BIGNUM *pBVar9;
  BIGNUM *pBVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  pt_aff_t_conflict1 (*papVar15) [16];
  long lVar16;
  pt_aff_t_conflict1 *arg3;
  ulong uVar17;
  uint uVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  uchar b_n [32];
  uchar b_x [32];
  int8_t rnaf [52];
  uchar b_y [32];
  long local_348;
  long lStack_340;
  long local_318;
  long lStack_310;
  long local_308;
  long lStack_300;
  long local_2f8;
  long lStack_2f0;
  undefined1 local_2c8 [24];
  undefined8 uStack_2b0;
  ulong local_2a8;
  uint64_t auStack_2a0 [5];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  ulong local_258;
  uint64_t local_250;
  long local_248;
  long local_240;
  long local_238;
  ulong local_230;
  uint64_t local_228 [5];
  undefined8 local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  ulong local_1e0;
  byte local_1d8 [32];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  uint64_t local_198;
  limb_t lStack_190;
  limb_t lStack_188;
  limb_t lStack_180;
  undefined1 auStack_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  uint64_t local_148;
  limb_t lStack_140;
  limb_t lStack_138;
  limb_t lStack_130;
  undefined1 auStack_128 [16];
  int8_t local_118 [64];
  undefined1 local_d8 [32];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  BN_CTX_start((BN_CTX *)ctx);
  pBVar9 = BN_CTX_get((BN_CTX *)ctx);
  pBVar10 = BN_CTX_get((BN_CTX *)ctx);
  iVar8 = 0;
  if ((pBVar10 != (BIGNUM *)0x0) &&
     (iVar7 = BN_bn2lebinpad(n,local_1d8,0x20), iVar8 = 0, iVar7 == 0x20)) {
    local_118[0x20] = '\0';
    local_118[0x21] = '\0';
    local_118[0x22] = '\0';
    local_118[0x23] = '\0';
    local_118[0x24] = '\0';
    local_118[0x25] = '\0';
    local_118[0x26] = '\0';
    local_118[0x27] = '\0';
    local_118[0x28] = '\0';
    local_118[0x29] = '\0';
    local_118[0x2a] = '\0';
    local_118[0x2b] = '\0';
    local_118[0x2c] = '\0';
    local_118[0x2d] = '\0';
    local_118[0x2e] = '\0';
    local_118[0x2f] = '\0';
    local_118[0x10] = '\0';
    local_118[0x11] = '\0';
    local_118[0x12] = '\0';
    local_118[0x13] = '\0';
    local_118[0x14] = '\0';
    local_118[0x15] = '\0';
    local_118[0x16] = '\0';
    local_118[0x17] = '\0';
    local_118[0x18] = '\0';
    local_118[0x19] = '\0';
    local_118[0x1a] = '\0';
    local_118[0x1b] = '\0';
    local_118[0x1c] = '\0';
    local_118[0x1d] = '\0';
    local_118[0x1e] = '\0';
    local_118[0x1f] = '\0';
    local_118[0] = '\0';
    local_118[1] = '\0';
    local_118[2] = '\0';
    local_118[3] = '\0';
    local_118[4] = '\0';
    local_118[5] = '\0';
    local_118[6] = '\0';
    local_118[7] = '\0';
    local_118[8] = '\0';
    local_118[9] = '\0';
    local_118[10] = '\0';
    local_118[0xb] = '\0';
    local_118[0xc] = '\0';
    local_118[0xd] = '\0';
    local_118[0xe] = '\0';
    local_118[0xf] = '\0';
    local_118[0x30] = '\0';
    local_118[0x31] = '\0';
    local_118[0x32] = '\0';
    local_118[0x33] = '\0';
    memset(local_1b8,0,0xa0);
    memset(local_d8,0,0xa0);
    local_258 = 0;
    local_268 = ZEXT816(0);
    local_278 = ZEXT816(0);
    auStack_2a0[3] = 0;
    auStack_2a0[4] = 0;
    auStack_2a0[1] = 0;
    auStack_2a0[2] = 0;
    local_2a8 = 0;
    auStack_2a0[0] = 0;
    stack0xfffffffffffffd48 = ZEXT816(0);
    local_2c8._0_16_ = ZEXT816(0);
    scalar_rwnaf(local_118,local_1d8);
    local_198 = 0;
    local_1a8 = (undefined1  [16])0x0;
    local_1b8 = (undefined1  [16])0x0;
    lStack_190 = const_one[0];
    lStack_188 = const_one[1];
    lStack_180 = 0;
    auStack_178 = ZEXT816(0);
    local_168 = (undefined1  [16])0x0;
    local_158 = (undefined1  [16])0x0;
    local_148 = 0;
    lStack_130 = 0;
    auStack_128 = ZEXT816(0);
    lStack_340 = local_348;
    local_348 = local_200;
    lStack_2f0 = local_2f8;
    local_2f8 = local_1f8;
    lStack_310 = local_318;
    local_318 = local_1f0;
    lStack_300 = local_308;
    local_308 = local_1e8;
    lVar13 = 3;
    uVar14 = local_230;
    auVar25._0_8_ = local_250;
    auVar25._8_8_ = local_248;
    auVar24._0_8_ = local_240;
    uVar17 = local_1e0;
    auVar24._8_8_ = local_238;
    lStack_140 = lStack_190;
    lStack_138 = lStack_188;
    do {
      if (lVar13 != 3) {
        uVar18 = 0;
        do {
          point_double((pt_prj_t_conflict1 *)local_1b8,(pt_prj_t_conflict1 *)local_1b8);
          if (lVar13 == 3) break;
          bVar19 = uVar18 < 4;
          uVar18 = uVar18 + 1;
        } while (bVar19);
      }
      papVar15 = lut_cmb;
      lVar16 = 0;
      do {
        uVar11 = lVar13 + lVar16 * 4;
        if (uVar11 < 0x34) {
          cVar1 = local_118[uVar11];
          cVar2 = cVar1 >> 7;
          auVar25._8_8_ = 0;
          arg3 = *papVar15;
          do {
            bVar19 = (int)((int)(char)(-1 - cVar2) + ((int)cVar1 >> 0x1f ^ (int)cVar1) >> 1 ^
                          (uint)auVar25._8_8_) < 1;
            fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz
                      ((uint64_t *)local_2c8,bVar19,(uint64_t *)local_2c8,arg3->X);
            fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz
                      (auStack_2a0,bVar19,auStack_2a0,arg3->Y);
            fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz
                      ((uint64_t *)local_278,bVar19,(uint64_t *)local_278,arg3->T);
            auVar25._8_8_ = auVar25._8_8_ + 1;
            arg3 = arg3 + 1;
          } while (auVar25._8_8_ != 0x10);
          uVar14 = 0xffffffffffffe - local_2a8;
          uVar17 = 0xffffffffffffe - local_258;
          uVar11 = (ulong)cVar2;
          uVar12 = ~uVar11;
          local_2a8 = local_2a8 & uVar12 | uVar11 & uVar14;
          auVar24._0_8_ = 0xffffffffffffe - local_2c8._16_8_;
          auVar24._8_8_ = 0xffffffffffffe - local_2c8._24_8_;
          auVar25._0_8_ = 0x1ffffffffffb2e - local_2c8._0_8_;
          auVar25._8_8_ = 0xffffffffffffe - local_2c8._8_8_;
          auVar20._0_4_ = (uint)cVar2;
          auVar20._4_4_ = 0;
          auVar20._8_4_ = auVar20._0_4_;
          auVar20._12_4_ = 0;
          auVar22._8_4_ = (int)uVar12;
          auVar22._0_8_ = uVar12;
          auVar22._12_4_ = (int)(uVar12 >> 0x20);
          local_2c8._0_16_ = local_2c8._0_16_ & auVar22 | auVar20 & auVar25;
          register0x000012c0 = stack0xfffffffffffffd48 & auVar22 | auVar20 & auVar24;
          local_258 = uVar12 & local_258 | uVar11 & uVar17;
          auVar26._0_8_ = 0xffffffffffffe - local_268._0_8_;
          auVar26._8_8_ = 0xffffffffffffe - local_268._8_8_;
          auVar27._0_8_ = 0x1ffffffffffb2e - local_278._0_8_;
          auVar27._8_8_ = 0xffffffffffffe - local_278._8_8_;
          local_278 = local_278 & auVar22 | auVar20 & auVar27;
          local_268 = auVar22 & local_268 | auVar20 & auVar26;
          point_add_mixed((pt_prj_t_conflict1 *)local_1b8,(pt_prj_t_conflict1 *)local_1b8,
                          (pt_aff_t_conflict1 *)local_2c8);
          lStack_340 = auVar24._8_8_;
          local_348 = auVar27._0_8_;
          lStack_2f0 = auVar25._8_8_;
          local_2f8 = auVar27._8_8_;
          lStack_310 = auVar27._8_8_;
          local_318 = auVar26._0_8_;
          lStack_300 = auVar26._8_8_;
          local_308 = auVar26._8_8_;
        }
        lVar16 = lVar16 + 1;
        papVar15 = (pt_aff_t_conflict1 (*) [16])((long)papVar15 + 0x780);
      } while (lVar16 != 0xe);
      bVar19 = lVar13 != 0;
      lVar13 = lVar13 + -1;
    } while (bVar19);
    local_200 = local_348;
    local_1f8 = local_2f8;
    local_1f0 = local_318;
    local_1e8 = local_308;
    local_2c8._8_8_ = 0xffffffffffffe;
    local_2c8._0_8_ = 0x1ffffffffffb21;
    uStack_2b0 = 0xffffffffffffe;
    local_2c8._16_8_ = 0xffffffffffffe;
    local_2a8 = 0xffffffffffffe;
    auStack_2a0[2] = 0x60ec939cfdf1b;
    auStack_2a0[3] = 0x6cd212230e3ea;
    auStack_2a0[0] = 0xb2592dba300e7;
    auStack_2a0[1] = 0x3e87f22e81f92;
    auStack_2a0[4] = 0x30650f195523a;
    local_278._8_8_ = 0xd318b3a36658b;
    local_278._0_8_ = 0x1f178ad8b8e5cf;
    local_268._8_8_ = 0xf955143846d13;
    local_268._0_8_ = 0x93fc81071ab99;
    local_258 = 0x8ade3bb6ad301;
    local_250 = auVar25._0_8_;
    local_248 = auVar25._8_8_;
    local_240 = auVar24._0_8_;
    local_238 = auVar24._8_8_;
    local_230 = uVar14;
    local_1e0 = uVar17;
    point_add_mixed((pt_prj_t_conflict1 *)local_d8,(pt_prj_t_conflict1 *)local_1b8,
                    (pt_aff_t_conflict1 *)local_2c8);
    auVar24._0_8_ = -(ulong)(local_1d8[0] & 1);
    auVar25._8_8_ = (ulong)(local_1d8[0] & 1) - 1;
    auVar21._8_4_ = (int)auVar24._0_8_;
    auVar21._0_8_ = auVar24._0_8_;
    auVar21._12_4_ = (int)((ulong)auVar24._0_8_ >> 0x20);
    auVar23._8_4_ = (int)auVar25._8_8_;
    auVar23._0_8_ = auVar25._8_8_;
    auVar23._12_4_ = (int)((ulong)auVar25._8_8_ >> 0x20);
    local_1b8 = local_d8._0_16_ & auVar23 | local_1b8 & auVar21;
    local_1a8 = local_d8._16_16_ & auVar23 | local_1a8 & auVar21;
    auVar3._8_8_ = lStack_190;
    auVar3._0_8_ = local_198;
    auVar24 = local_b8 & auVar23 | auVar3 & auVar21;
    local_198 = auVar24._0_8_;
    lStack_190 = auVar24._8_8_;
    auVar4._8_8_ = lStack_180;
    auVar4._0_8_ = lStack_188;
    auVar24 = local_a8 & auVar23 | auVar4 & auVar21;
    lStack_188 = auVar24._0_8_;
    lStack_180 = auVar24._8_8_;
    auStack_178 = local_98 & auVar23 | auStack_178 & auVar21;
    local_168 = local_88 & auVar23 | local_168 & auVar21;
    local_158 = local_78 & auVar23 | local_158 & auVar21;
    auVar5._8_8_ = lStack_140;
    auVar5._0_8_ = local_148;
    auVar24 = local_68 & auVar23 | auVar5 & auVar21;
    local_148 = auVar24._0_8_;
    lStack_140 = auVar24._8_8_;
    auVar6._8_8_ = lStack_130;
    auVar6._0_8_ = lStack_138;
    auVar24 = local_58 & auVar23 | auVar6 & auVar21;
    lStack_138 = auVar24._0_8_;
    lStack_130 = auVar24._8_8_;
    auStack_128 = auVar23 & local_48 | auVar21 & auStack_128;
    point_edwards2legacy((pt_prj_t_conflict1 *)local_1b8,(pt_prj_t_conflict1 *)local_1b8);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_inv(&lStack_140,&lStack_140);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul
              (&local_250,(uint64_t *)local_1b8,&lStack_140);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(local_228,&lStack_190,&lStack_140);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_to_bytes(local_1b8,&local_250);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_to_bytes(local_d8,local_228);
    iVar8 = CRYPTO_memcmp("",local_1b8,0x20);
    if ((iVar8 == 0) && (iVar8 = CRYPTO_memcmp("",local_d8,0x20), iVar8 == 0)) {
      iVar8 = EC_POINT_set_to_infinity((EC_GROUP *)group,(EC_POINT *)r);
      if (iVar8 == 0) {
        iVar8 = 0;
        goto LAB_00130ed6;
      }
    }
    else {
      auVar25._8_8_ = BN_lebin2bn(local_1b8,0x20,pBVar9);
      iVar8 = 0;
      if ((auVar25._8_8_ == 0) ||
         ((auVar25._8_8_ = BN_lebin2bn(local_d8,0x20,pBVar10), auVar25._8_8_ == 0 ||
          (iVar7 = EC_POINT_set_affine_coordinates(group,r,pBVar9,pBVar10,ctx), iVar7 == 0))))
      goto LAB_00130ed6;
    }
    iVar8 = 1;
  }
LAB_00130ed6:
  BN_CTX_end((BN_CTX *)ctx);
  return iVar8;
}

Assistant:

int
    point_mul_g_id_tc26_gost_3410_2012_256_paramSetA(const EC_GROUP *group,
                                                     EC_POINT *r,
                                                     const BIGNUM *n,
                                                     BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[32];
    unsigned char b_y[32];
    unsigned char b_n[32];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL || BN_bn2lebinpad(n, b_n, 32) != 32)
        goto err;
    /* do the fixed scalar multiplication */
    point_mul_g(b_x, b_y, b_n);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 32) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 32) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 32, x) == NULL ||
            BN_lebin2bn(b_y, 32, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}